

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m2v_L_invmult_inplace_p(m2v *LU,int rank,m2v *X_inout,int *placements)

{
  uint *puVar1;
  int iVar2;
  m2v_base *pmVar3;
  m2v_base *pmVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  
  if (0 < rank) {
    uVar5 = 0;
    do {
      iVar6 = (int)uVar5;
      if (placements != (int *)0x0) {
        iVar6 = placements[uVar5];
      }
      if (uVar5 != 0) {
        pmVar3 = LU->e;
        uVar7 = 0;
        do {
          uVar8 = (uint)uVar7;
          if (placements != (int *)0x0) {
            uVar8 = placements[uVar7];
          }
          if (((pmVar3[(int)(((uint)(uVar7 >> 5) & 0x7ffffff) + LU->row_stride * (int)uVar5)] >>
                ((uint)uVar7 & 0x1f) & 1) != 0) && (iVar2 = X_inout->row_stride, 0 < iVar2)) {
            pmVar4 = X_inout->e;
            lVar9 = 0;
            do {
              puVar1 = pmVar4 + iVar2 * iVar6 + lVar9;
              *puVar1 = *puVar1 ^ pmVar4[(int)(uVar8 * iVar2) + lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 < X_inout->row_stride);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar5);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)rank);
  }
  return;
}

Assistant:

void MV_GEN_N(_L_invmult_inplace_p)(const MV_GEN_TYPE* LU,
				int rank,
				MV_GEN_TYPE* X_inout,
				const int* placements)
{
	/* Apply L^(-1) */
	for (int i = 0; i < rank; ++i) {
		const int pi = (placements ? placements[i] : i);
		for (int j = 0; j < i; ++j) {
			const int pj = (placements ? placements[j] : j);
			MV_GEN_N(_multadd_row)(X_inout, pj,
					MV_GEN_N(_get_el)(LU, i, j),
					X_inout, pi);
		}
	}
}